

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

mp_int * generate_rsa_prime(RSAPrimeDetails pd,PrimeGenerationContext *pgc,ProgressReceiver *prog)

{
  PrimeCandidateSource *pPVar1;
  mp_int *mod;
  mp_int *x;
  mp_int *pmVar2;
  mp_int *local_38;
  
  if (pd.strong == true) {
    (*prog->vt->start_phase)(prog,(ProgressPhase)pd.phase_m1m1.p);
    pPVar1 = pcs_new_with_firstbits(pd.bitsm1m1,pd.firstbits,0xd);
    local_38 = (*pgc->vt->generate)(pgc,pPVar1,prog);
    (*prog->vt->report_phase_complete)(prog);
    (*prog->vt->start_phase)(prog,(ProgressPhase)pd.phase_m1.p);
    pPVar1 = pcs_new_with_firstbits(pd.bitsm1,pd.firstbits,0xd);
    pcs_require_residue_1_mod_prime(pPVar1,local_38);
    mod = (*pgc->vt->generate)(pgc,pPVar1,prog);
    (*prog->vt->report_phase_complete)(prog);
    (*prog->vt->start_phase)(prog,(ProgressPhase)pd.phase_p1.p);
    pPVar1 = pcs_new_with_firstbits(pd.bitsp1,pd.firstbits,0xd);
    x = (*pgc->vt->generate)(pgc,pPVar1,prog);
    (*prog->vt->report_phase_complete)(prog);
  }
  else {
    mod = (mp_int *)0x0;
    x = (mp_int *)0x0;
    local_38 = (mp_int *)0x0;
  }
  (*prog->vt->start_phase)(prog,(ProgressPhase)pd.phase_main.p);
  pPVar1 = pcs_new_with_firstbits(pd.bits,pd.firstbits,0xd);
  pcs_avoid_residue_small(pPVar1,0x10001,1);
  if (pd.strong != false) {
    pcs_require_residue_1_mod_prime(pPVar1,mod);
    pmVar2 = mp_copy(x);
    mp_sub_integer_into(pmVar2,x,1);
    pcs_require_residue(pPVar1,x,pmVar2);
    mp_free(pmVar2);
  }
  pmVar2 = (*pgc->vt->generate)(pgc,pPVar1,prog);
  (*prog->vt->report_phase_complete)(prog);
  if (local_38 != (mp_int *)0x0) {
    mp_free(local_38);
  }
  if (mod != (mp_int *)0x0) {
    mp_free(mod);
  }
  if (x != (mp_int *)0x0) {
    mp_free(x);
  }
  return pmVar2;
}

Assistant:

static mp_int *generate_rsa_prime(
    RSAPrimeDetails pd, PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    mp_int *m1m1 = NULL, *m1 = NULL, *p1 = NULL, *p = NULL;
    PrimeCandidateSource *pcs;

    if (pd.strong) {
        progress_start_phase(prog, pd.phase_m1m1);
        pcs = pcs_new_with_firstbits(pd.bitsm1m1, pd.firstbits, NFIRSTBITS);
        m1m1 = primegen_generate(pgc, pcs, prog);
        progress_report_phase_complete(prog);

        progress_start_phase(prog, pd.phase_m1);
        pcs = pcs_new_with_firstbits(pd.bitsm1, pd.firstbits, NFIRSTBITS);
        pcs_require_residue_1_mod_prime(pcs, m1m1);
        m1 = primegen_generate(pgc, pcs, prog);
        progress_report_phase_complete(prog);

        progress_start_phase(prog, pd.phase_p1);
        pcs = pcs_new_with_firstbits(pd.bitsp1, pd.firstbits, NFIRSTBITS);
        p1 = primegen_generate(pgc, pcs, prog);
        progress_report_phase_complete(prog);
    }

    progress_start_phase(prog, pd.phase_main);
    pcs = pcs_new_with_firstbits(pd.bits, pd.firstbits, NFIRSTBITS);
    pcs_avoid_residue_small(pcs, RSA_EXPONENT, 1);
    if (pd.strong) {
        pcs_require_residue_1_mod_prime(pcs, m1);
        mp_int *p1_minus_1 = mp_copy(p1);
        mp_sub_integer_into(p1_minus_1, p1, 1);
        pcs_require_residue(pcs, p1, p1_minus_1);
        mp_free(p1_minus_1);
    }
    p = primegen_generate(pgc, pcs, prog);
    progress_report_phase_complete(prog);

    if (m1m1)
        mp_free(m1m1);
    if (m1)
        mp_free(m1);
    if (p1)
        mp_free(p1);

    return p;
}